

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_ecc.c
# Opt level: O3

tc_uECC_word_t
tc_uECC_vli_sub(tc_uECC_word_t *result,tc_uECC_word_t *left,tc_uECC_word_t *right,
               wordcount_t num_words)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  
  if ('\0' < num_words) {
    uVar2 = 0;
    uVar1 = 0;
    do {
      uVar3 = right[uVar2] + uVar1;
      if (uVar3 != 0) {
        uVar1 = 0;
      }
      uVar1 = uVar1 | left[uVar2] < uVar3;
      result[uVar2] = left[uVar2] - uVar3;
      uVar2 = uVar2 + 1;
    } while ((byte)num_words != uVar2);
    return uVar1;
  }
  return 0;
}

Assistant:

tc_uECC_word_t tc_uECC_vli_sub(tc_uECC_word_t *result, const tc_uECC_word_t *left,
			 const tc_uECC_word_t *right, wordcount_t num_words)
{
	tc_uECC_word_t borrow = 0;
	wordcount_t i;
	for (i = 0; i < num_words; ++i) {
		tc_uECC_word_t diff = left[i] - right[i] - borrow;
		tc_uECC_word_t val = (diff > left[i]);
		borrow = cond_set(val, borrow, (diff != left[i]));

		result[i] = diff;
	}
	return borrow;
}